

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

bool google::protobuf::internal::
     VisitMapKey<google::protobuf::internal::UntypedMapBase_const,google::protobuf::internal::MapFieldBase::LookupMapValueNoSync(google::protobuf::MapKey_const&,google::protobuf::MapValueConstRef*)const::__0>
               (MapKey *map_key,UntypedMapBase *map,anon_class_8_1_ba1d8281 f)

{
  UntypedMapBase *map_00;
  bool v;
  CppType CVar1;
  uint v_00;
  uint32_t v_01;
  unsigned_long v_02;
  uint64_t v_03;
  string_view local_68;
  ViewType local_58;
  bool local_41;
  unsigned_long local_40;
  unsigned_long local_38;
  uint local_30;
  uint local_2c;
  UntypedMapBase *local_28;
  UntypedMapBase *map_local;
  MapKey *map_key_local;
  anon_class_8_1_ba1d8281 f_local;
  
  local_28 = map;
  map_local = (UntypedMapBase *)map_key;
  map_key_local = (MapKey *)f.val;
  CVar1 = MapKey::type(map_key);
  map_00 = local_28;
  switch(CVar1) {
  case CPPTYPE_INT32:
    v_00 = MapKey::GetInt32Value((MapKey *)map_local);
    local_2c = TransparentSupport<unsigned_int>::ToView(v_00);
    f_local.val._7_1_ =
         const::$_0::operator()((__0 *)&map_key_local,(KeyMapBase<unsigned_int> *)map_00,&local_2c);
    break;
  case CPPTYPE_INT64:
    v_02 = MapKey::GetInt64Value((MapKey *)map_local);
    local_38 = TransparentSupport<unsigned_long>::ToView(v_02);
    f_local.val._7_1_ =
         const::$_0::operator()((__0 *)&map_key_local,(KeyMapBase<unsigned_long> *)map_00,&local_38)
    ;
    break;
  case CPPTYPE_UINT32:
    v_01 = MapKey::GetUInt32Value((MapKey *)map_local);
    local_30 = TransparentSupport<unsigned_int>::ToView(v_01);
    f_local.val._7_1_ =
         const::$_0::operator()((__0 *)&map_key_local,(KeyMapBase<unsigned_int> *)map_00,&local_30);
    break;
  case CPPTYPE_UINT64:
    v_03 = MapKey::GetUInt64Value((MapKey *)map_local);
    local_40 = TransparentSupport<unsigned_long>::ToView(v_03);
    f_local.val._7_1_ =
         const::$_0::operator()((__0 *)&map_key_local,(KeyMapBase<unsigned_long> *)map_00,&local_40)
    ;
    break;
  default:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.cc"
                ,0x46);
  case CPPTYPE_BOOL:
    v = MapKey::GetBoolValue((MapKey *)map_local);
    local_41 = TransparentSupport<bool>::ToView(v);
    f_local.val._7_1_ =
         const::$_0::operator()((__0 *)&map_key_local,(KeyMapBase<bool> *)map_00,&local_41);
    break;
  case CPPTYPE_STRING:
    local_68 = MapKey::GetStringValue((MapKey *)map_local);
    local_58 = TransparentSupport<std::__cxx11::string>::
               ToView<std::basic_string_view<char,std::char_traits<char>>>(&local_68);
    f_local.val._7_1_ =
         const::$_0::operator()
                   ((__0 *)&map_key_local,
                    (KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)map_00,&local_58);
  }
  return f_local.val._7_1_;
}

Assistant:

auto VisitMapKey(const MapKey& map_key, Map& map, F f) {
  switch (map_key.type()) {
#define HANDLE_TYPE(CPPTYPE, Type, KeyBaseType)                               \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {                                  \
    using KMB = KeyMapBase<KeyBaseType>;                                      \
    return f(                                                                 \
        static_cast<                                                          \
            std::conditional_t<std::is_const_v<Map>, const KMB&, KMB&>>(map), \
        TransparentSupport<KeyBaseType>::ToView(map_key.Get##Type##Value())); \
  }
    HANDLE_TYPE(INT32, Int32, uint32_t);
    HANDLE_TYPE(UINT32, UInt32, uint32_t);
    HANDLE_TYPE(INT64, Int64, uint64_t);
    HANDLE_TYPE(UINT64, UInt64, uint64_t);
    HANDLE_TYPE(BOOL, Bool, bool);
    HANDLE_TYPE(STRING, String, std::string);
#undef HANDLE_TYPE
    default:
      Unreachable();
  }
}